

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O1

void tree_print_snode(lyout *out,int level,uint16_t max_name_len,lys_node *node,int mask,
                     lys_node *aug_parent,int subtree,tp_opts *opts)

{
  long lVar1;
  lys_ext_instance **pplVar2;
  byte bVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  lys_node *plVar7;
  lys_module *plVar8;
  lys_module *plVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  LYS_NODE LVar13;
  lys_iffeature *iff2;
  uint8_t iff1_size;
  int iVar14;
  undefined6 in_register_00000012;
  uint uVar15;
  char *pcVar16;
  lys_iffeature *iff1;
  lys_ext_instance *plVar17;
  uint8_t iff2_size;
  ushort uVar18;
  lys_node **pplVar19;
  bool bVar20;
  char *local_60;
  lys_node *local_50;
  char *text_str;
  ulong local_40;
  int local_38;
  int local_34;
  
  uVar15 = 0;
  if (node->parent != (lys_node *)0x0) {
    uVar15 = (uint)(node->parent->nodetype == LYS_AUGMENT);
  }
  plVar7 = lys_is_disabled(node,uVar15);
  if (plVar7 != (lys_node *)0x0) {
    return;
  }
  LVar13 = node->nodetype & mask;
  if (LVar13 == LYS_UNKNOWN) {
    return;
  }
  if (((LVar13 & (LYS_OUTPUT|LYS_INPUT|LYS_CASE)) != LYS_UNKNOWN) && ((node->flags & 0x40) != 0)) {
    if (node->nodetype != LYS_CASE) {
      return;
    }
    plVar7 = lys_is_disabled(node->child,0);
    if (plVar7 != (lys_node *)0x0) {
      return;
    }
  }
  LVar13 = node->nodetype & mask;
  text_str._4_4_ = mask;
  local_38 = level;
  if (LVar13 == LYS_ANYXML) {
    plVar7 = lys_parent(node);
    if ((plVar7 == (lys_node *)0x0) &&
       ((iVar5 = strcmp(node->name,"config"), iVar5 == 0 &&
        (iVar5 = strcmp(node->module->name,"ietf-netconf"), iVar5 == 0)))) {
      return;
    }
LAB_00198768:
    iVar5 = tree_print_indent(out,level,opts);
    pcVar16 = "o";
    if ((node->flags & 0x20) == 0) {
      pcVar16 = "+";
    }
    pcVar12 = "x";
    if ((node->flags & 0x10) == 0) {
      pcVar12 = pcVar16;
    }
    local_34 = ly_print(out,"%s--",pcVar12);
    LVar13 = node->nodetype;
    if ((int)LVar13 < 0x100) {
      if (LVar13 == LYS_CASE) {
        pcVar16 = ":(";
        goto LAB_0019880b;
      }
      if (LVar13 == LYS_NOTIF) {
        pcVar16 = "-n ";
        goto LAB_0019880b;
      }
LAB_001988f0:
      if (opts->spec_config == 2) {
        pcVar16 = "ro ";
LAB_00198ca8:
        iVar6 = ly_print(out,pcVar16);
      }
      else {
        if (opts->spec_config == 1) {
          pcVar16 = "-w ";
          goto LAB_00198ca8;
        }
        pcVar16 = "ro";
        if ((node->flags & 2) == 0) {
          pcVar16 = "--";
        }
        pcVar12 = "rw";
        if ((node->flags & 1) == 0) {
          pcVar12 = pcVar16;
        }
        iVar6 = ly_print(out,"%s ",pcVar12);
      }
      if (node->nodetype == LYS_CHOICE) {
        iVar14 = ly_print(out,"(");
        iVar6 = iVar6 + iVar14;
      }
      local_40 = CONCAT44(local_40._4_4_,iVar6);
    }
    else {
      if (LVar13 != LYS_ACTION) {
        if (LVar13 == LYS_USES) {
          pcVar16 = "-u ";
          goto LAB_0019880b;
        }
        if (LVar13 != LYS_RPC) goto LAB_001988f0;
      }
      pcVar16 = "-x ";
LAB_0019880b:
      iVar6 = ly_print(out,pcVar16);
      local_40 = CONCAT44(local_40._4_4_,iVar6);
    }
    plVar8 = lys_node_module(node);
    plVar9 = lys_main_module(opts->module);
    if (plVar9 == plVar8) {
      uVar15 = 0;
    }
    else {
      uVar15 = ly_print(out,"%s:",
                        *(undefined8 *)(plVar8->padding2 + (ulong)(opts->options & 1) * 8 + -0x3a));
      uVar15 = uVar15 & 0xffff;
    }
    local_34 = local_34 + iVar5;
    iVar5 = ly_print(out,node->name);
    mask = text_str._4_4_;
    iVar5 = iVar5 + uVar15;
    LVar13 = node->nodetype & text_str._4_4_;
    pcVar16 = "*";
    if ((int)LVar13 < 0x10) {
      switch(LVar13) {
      case LYS_CONTAINER:
        lVar1._0_2_ = node[1].flags;
        lVar1._2_1_ = node[1].ext_size;
        lVar1._3_1_ = node[1].iffeature_size;
        lVar1._4_1_ = node[1].padding[0];
        lVar1._5_1_ = node[1].padding[1];
        lVar1._6_1_ = node[1].padding[2];
        lVar1._7_1_ = node[1].padding[3];
        if (lVar1 != 0) {
          pcVar16 = "!";
          goto switchD_001988a3_caseD_8;
        }
        break;
      case LYS_CHOICE:
        iVar6 = ly_print(out,")");
        iVar5 = iVar5 + iVar6;
        bVar3 = (byte)node->flags;
joined_r0x001988ec:
        if ((bVar3 & 0x40) == 0) {
LAB_00198945:
          pcVar16 = "?";
          goto switchD_001988a3_caseD_8;
        }
        break;
      case LYS_LEAF:
        if (((node->flags & 0x40) == 0) && (iVar6 = tree_leaf_is_mandatory(node), iVar6 == 0))
        goto LAB_00198945;
        break;
      case LYS_LEAFLIST:
switchD_001988a3_caseD_8:
        iVar6 = ly_print(out,pcVar16);
        iVar5 = iVar5 + iVar6;
      }
    }
    else if ((int)LVar13 < 0x40) {
      if (LVar13 == LYS_LIST) goto switchD_001988a3_caseD_8;
      if (LVar13 == LYS_ANYXML) {
LAB_001988e7:
        bVar3 = (byte)node->flags;
        goto joined_r0x001988ec;
      }
    }
    else {
      if (LVar13 == LYS_CASE) {
        pcVar16 = ")";
        goto switchD_001988a3_caseD_8;
      }
      if (LVar13 == LYS_ANYDATA) goto LAB_001988e7;
    }
    local_34 = local_34 + (int)local_40;
    if (subtree == 0) {
      if (local_38 < 0x40) {
        local_40 = 1L << ((byte)local_38 & 0x3f);
        bVar3 = (byte)local_38 & 0x3f;
        opts->indent = opts->indent & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        if (node->nodetype == LYS_CASE) {
          bVar20 = false;
        }
        else {
          plVar7 = lys_parent(node);
          if ((((plVar7 == (lys_node *)0x0) ||
               (plVar7 = lys_parent(node), (plVar7->nodetype & (LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN
               )) || (node->next == (lys_node *)0x0)) ||
             (plVar7 = lys_parent(node->next), plVar7 == (lys_node *)0x0)) {
            bVar20 = false;
          }
          else {
            plVar7 = lys_parent(node->next);
            bVar20 = plVar7->nodetype == LYS_CHOICE;
          }
        }
        iVar6 = tree_sibling_is_valid_child(node,0,opts->module,aug_parent,node->nodetype);
        mask = text_str._4_4_;
        if ((!bVar20) && (iVar6 != 0)) {
          opts->indent = opts->indent | local_40;
        }
      }
      else {
        ly_log(node->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
               ,0x9d);
      }
    }
    iVar14 = local_34 + iVar5;
    iVar6 = local_38 + 1;
    LVar13 = node->nodetype & mask;
    local_38 = iVar6;
    if ((int)LVar13 < 0x10) {
      if ((LVar13 == LYS_LEAF) || (LVar13 == LYS_LEAFLIST)) {
        if (max_name_len == 0) {
          local_34 = iVar14;
          __assert_fail("max_name_len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
                        ,0x25c,
                        "void tree_print_snode(struct lyout *, int, uint16_t, const struct lys_node *, int, const struct lys_node *, int, tp_opts *)"
                       );
        }
        iVar5 = (int)CONCAT62(in_register_00000012,max_name_len) - iVar5;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),(char)iVar5 + '\x03');
        uVar15 = opts->options;
        plVar8 = (lys_module *)node[1].iffeature[1].features;
        local_40 = CONCAT44(local_40._4_4_,uVar4);
        if ((*(int *)&node[1].ref == 9) && (node[1].ext[6] == (lys_ext_instance *)0x0)) {
          if ((uVar15 & 8) == 0) {
            plVar9 = node[1].module;
            if ((uVar15 & 1) == 0) {
              local_34 = iVar14;
              sVar11 = strlen((char *)plVar9);
              pcVar16 = (char *)malloc((long)((int)sVar11 + 4));
              if (pcVar16 != (char *)0x0) {
                sVar11 = (size_t)((int)sVar11 + 3);
                sprintf(pcVar16,"-> %s",plVar9);
                goto LAB_00198d81;
              }
            }
            else {
              local_34 = iVar14;
              pcVar16 = transform_json2schema(plVar8,(char *)plVar9);
              sVar11 = strlen(pcVar16);
              pcVar12 = (char *)malloc((long)((int)sVar11 + 4));
              if (pcVar12 != (char *)0x0) {
                uVar18 = (short)sVar11 + 3;
                sprintf(pcVar12,"-> %s",pcVar16);
                local_50 = (lys_node *)lydict_insert_zc(plVar8->ctx,pcVar12);
                lydict_remove(plVar8->ctx,pcVar16);
                goto LAB_00198d91;
              }
            }
LAB_00199243:
            uVar18 = 0;
            ly_log(plVar8->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","tree_print_type"
                  );
            goto LAB_00198d91;
          }
          local_34 = iVar14;
          local_50 = (lys_node *)lydict_insert(plVar8->ctx,"leafref",7);
          uVar18 = 7;
        }
        else {
          local_34 = iVar14;
          iVar5 = lys_type_is_local((lys_type *)&node[1].ref);
          if (iVar5 == 0) {
            pplVar2 = node[1].ext;
            local_60 = (char *)pplVar2[6]->parent;
            if ((uVar15 & 1) == 0) {
              sVar11 = strlen(local_60);
              plVar17 = *pplVar2;
            }
            else {
              local_60 = transform_module_name2import_prefix(plVar8,local_60);
              sVar11 = strlen(local_60);
              plVar17 = *node[1].ext;
            }
            sVar10 = strlen((char *)plVar17);
            sVar11 = sVar11 + sVar10 + 1;
            pcVar16 = (char *)malloc((long)((sVar11 << 0x20) + 0x100000000) >> 0x20);
            if (pcVar16 == (char *)0x0) goto LAB_00199243;
            sprintf(pcVar16,"%s:%s",local_60,plVar17);
LAB_00198d81:
            local_50 = (lys_node *)lydict_insert_zc(plVar8->ctx,pcVar16);
          }
          else {
            plVar17 = *node[1].ext;
            sVar11 = strlen((char *)plVar17);
            local_50 = (lys_node *)lydict_insert(plVar8->ctx,(char *)plVar17,(long)(int)sVar11);
          }
          uVar18 = (ushort)sVar11;
LAB_00198d91:
          uVar4 = (int)local_40;
        }
        iVar6 = local_38;
        iVar5 = tree_print_wrap(out,local_38,local_34,(uint8_t)uVar4,uVar18 & 0xff,opts);
        local_34 = ly_print(out,(char *)local_50);
        local_34 = local_34 + iVar5;
        lydict_remove(opts->module->ctx,(char *)local_50);
        mask = text_str._4_4_;
        iVar14 = local_34;
      }
    }
    else if (LVar13 == LYS_LIST) {
      local_34 = iVar14;
      iVar5 = tree_print_keys(out,*(lys_node_leaf ***)&node[1].flags,node->padding[2],opts,
                              (char **)&local_50);
      iVar6 = local_38;
      iVar14 = local_34;
      if ((char)iVar5 != '\0') {
        iVar5 = tree_print_wrap(out,local_38,local_34,'\x01',(ushort)iVar5 & 0xff,opts);
        local_34 = ly_print(out,(char *)local_50);
        mask = text_str._4_4_;
        local_34 = local_34 + iVar5;
        lydict_remove(opts->module->ctx,(char *)local_50);
        iVar14 = local_34;
      }
    }
    else {
      if (LVar13 == LYS_ANYXML) {
        if (max_name_len == 0) {
          __assert_fail("max_name_len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
                        ,0x26a,
                        "void tree_print_snode(struct lyout *, int, uint16_t, const struct lys_node *, int, const struct lys_node *, int, tp_opts *)"
                       );
        }
        iVar5 = tree_print_wrap(out,iVar6,iVar14,((char)max_name_len - (char)iVar5) + '\x03',6,opts)
        ;
        pcVar16 = "anyxml";
      }
      else {
        if (LVar13 != LYS_ANYDATA) goto LAB_00198ddf;
        if (max_name_len == 0) {
          __assert_fail("max_name_len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
                        ,0x264,
                        "void tree_print_snode(struct lyout *, int, uint16_t, const struct lys_node *, int, const struct lys_node *, int, tp_opts *)"
                       );
        }
        iVar5 = tree_print_wrap(out,iVar6,iVar14,((char)max_name_len - (char)iVar5) + '\x03',7,opts)
        ;
        pcVar16 = "anydata";
      }
      iVar14 = ly_print(out,pcVar16);
      mask = text_str._4_4_;
      iVar14 = iVar14 + iVar5;
    }
LAB_00198ddf:
    local_34 = iVar14;
    iVar5 = local_34;
    if ((opts->options & 1) == 0) {
      LVar13 = node->nodetype & mask;
      if (LVar13 == LYS_CHOICE) {
        pplVar19 = (lys_node **)node[1].name;
        iVar6 = local_38;
        if (pplVar19 != (lys_node **)0x0) {
          sVar11 = strlen((char *)*pplVar19);
          iVar5 = tree_print_wrap(out,local_38,iVar5,'\x01',(short)sVar11 + 2,opts);
          goto LAB_00198e78;
        }
      }
      else if ((LVar13 == LYS_LEAF) && (local_50 = node[1].prev, local_50 != (lys_node *)0x0)) {
        sVar11 = strlen((char *)local_50);
        iVar5 = tree_print_wrap(out,iVar6,iVar5,'\x01',(short)sVar11 + 2,opts);
        pplVar19 = &local_50;
LAB_00198e78:
        iVar6 = ly_print(out,"<%s>",*pplVar19);
        iVar5 = iVar6 + iVar5;
        mask = text_str._4_4_;
        iVar6 = local_38;
      }
    }
    LVar13 = node->nodetype & mask;
    if ((int)LVar13 < 0x80) {
      if ((LVar13 - LYS_CONTAINER < 0x40) &&
         ((0x800000008000808bU >> ((ulong)(LVar13 - LYS_CONTAINER) & 0x3f) & 1) != 0))
      goto LAB_00198ec7;
    }
    else if ((int)LVar13 < 0x1000) {
      if ((LVar13 == LYS_NOTIF) || (LVar13 == LYS_RPC)) goto LAB_00198ec7;
    }
    else if ((LVar13 == LYS_USES) || ((LVar13 == LYS_ANYDATA || (LVar13 == LYS_ACTION)))) {
LAB_00198ec7:
      plVar7 = node->parent;
      if ((plVar7 == (lys_node *)0x0) || (plVar7->nodetype != LYS_AUGMENT)) {
        iff1 = node->iffeature;
        iff1_size = node->iffeature_size;
        iff2 = (lys_iffeature *)0x0;
        iff2_size = '\0';
      }
      else {
        iff1 = node->iffeature;
        iff1_size = node->iffeature_size;
        iff2 = plVar7->iffeature;
        iff2_size = plVar7->iffeature_size;
      }
      iVar14 = tree_print_features(out,iff1,iff1_size,iff2,iff2_size,opts,(char **)&local_50);
      if ((char)iVar14 != '\0') {
        tree_print_wrap(out,iVar6,iVar5,'\x01',(ushort)iVar14 & 0xff,opts);
        ly_print(out,(char *)local_50);
        lydict_remove(opts->module->ctx,(char *)local_50);
      }
    }
    ly_print(out,"\n");
    if (subtree == 1) {
      return;
    }
    LVar13 = node->nodetype & mask;
    if ((int)LVar13 < 0x400) {
      if (LVar13 == LYS_NOTIF) {
LAB_00198fda:
        iVar5 = 2;
      }
      else {
        iVar5 = 1;
        if (LVar13 != LYS_INPUT) goto LAB_00198fe3;
      }
      opts->spec_config = iVar5;
    }
    else {
      if (LVar13 == LYS_USES) {
        return;
      }
      if (LVar13 == LYS_OUTPUT) goto LAB_00198fda;
    }
  }
  else if ((LVar13 != LYS_GROUPING) && ((LVar13 != LYS_USES || ((opts->options & 4) != 0))))
  goto LAB_00198768;
LAB_00198fe3:
  LVar13 = node->nodetype & mask;
  iVar5 = 0;
  bVar20 = true;
  if ((int)LVar13 < 0x100) {
    if (0xf < (int)LVar13) {
      if ((int)LVar13 < 0x40) {
        if (LVar13 == LYS_LIST) goto switchD_00199013_caseD_1;
        if (LVar13 == LYS_ANYXML) goto switchD_00199013_caseD_4;
      }
      else if ((LVar13 == LYS_CASE) || (LVar13 == LYS_NOTIF)) {
LAB_001990e4:
        plVar7 = node->child;
        iVar5 = 0x903f;
        iVar6 = 0x903f;
        goto LAB_001990f7;
      }
      goto switchD_00199013_caseD_3;
    }
    iVar5 = 0;
    switch(LVar13) {
    case LYS_CONTAINER:
switchD_00199013_caseD_1:
      plVar7 = node->child;
      iVar5 = 0xd0bf;
      iVar6 = 0xd0bf;
      break;
    case LYS_CHOICE:
      plVar7 = node->child;
      iVar5 = 0x807d;
      iVar6 = 0x807d;
      break;
    default:
      goto switchD_00199013_caseD_3;
    case LYS_LEAF:
    case LYS_LEAFLIST:
      goto switchD_00199013_caseD_4;
    }
LAB_001990f7:
    bVar20 = false;
    max_name_len = tree_get_max_name_len(plVar7,(lys_node *)0x0,iVar6,opts);
  }
  else {
    if ((int)LVar13 < 0x800) {
      if (LVar13 == LYS_RPC) {
LAB_001990ce:
        iVar5 = 0x600;
        bVar20 = false;
        goto switchD_00199013_caseD_4;
      }
      if ((LVar13 == LYS_INPUT) || (LVar13 == LYS_OUTPUT)) goto LAB_001990e4;
    }
    else if ((int)LVar13 < 0x4000) {
      if (LVar13 == LYS_GROUPING) goto switchD_00199013_caseD_1;
      if (LVar13 == LYS_USES) {
        iVar5 = 0xd0bf;
        bVar20 = false;
        goto LAB_00199137;
      }
    }
    else {
      if (LVar13 == LYS_ANYDATA) goto switchD_00199013_caseD_4;
      if (LVar13 == LYS_ACTION) goto LAB_001990ce;
    }
switchD_00199013_caseD_3:
    iVar5 = 0;
    ly_log(node->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
          );
switchD_00199013_caseD_4:
    max_name_len = 0;
  }
LAB_00199137:
  if (!bVar20) {
    for (plVar7 = node->child; plVar7 != (lys_node *)0x0; plVar7 = plVar7->next) {
      if ((((opts->module->field_0x40 & 1) == 0) || (plVar7->parent == node)) ||
         (plVar7->module == opts->module)) {
        tree_print_snode(out,local_38,max_name_len,plVar7,iVar5,(lys_node *)0x0,0,opts);
      }
    }
  }
  LVar13 = text_str._4_4_ & node->nodetype;
  if (((LVar13 == LYS_NOTIF) || (LVar13 == LYS_OUTPUT)) || (LVar13 == LYS_INPUT)) {
    opts->spec_config = 0;
  }
  return;
}

Assistant:

static void
tree_print_snode(struct lyout *out, int level, uint16_t max_name_len, const struct lys_node *node, int mask,
                 const struct lys_node *aug_parent, int subtree, tp_opts *opts)
{
    struct lys_node *sub;
    int line_len, node_len, child_mask;
    uint8_t text_len, text_indent;
    uint16_t max_child_len;
    const char *text_str;

    /* disabled/not printed node */
    if (lys_is_disabled(node, (node->parent && node->parent->nodetype == LYS_AUGMENT) ? 1 : 0) || !(node->nodetype & mask)) {
        return;
    }

    /* implicit input/output/case */
    if (((node->nodetype & mask) & (LYS_INPUT | LYS_OUTPUT | LYS_CASE)) && (node->flags & LYS_IMPLICIT)) {
        if ((node->nodetype != LYS_CASE) || lys_is_disabled(node->child, 0)) {
            return;
        }
    }

    /* special uses and grouping handling */
    switch (node->nodetype & mask) {
    case LYS_USES:
        if (opts->options & LYS_OUTOPT_TREE_USES) {
            break;
        }
        /* fallthrough */
    case LYS_GROUPING:
        goto print_children;
    case LYS_ANYXML:
        if (!lys_parent(node) && !strcmp(node->name, "config") && !strcmp(node->module->name, "ietf-netconf")) {
            /* node added by libyang, not actually in the model */
            return;
        }
        break;
    default:
        break;
    }

    /* print indent */
    line_len = tree_print_indent(out, level, opts);
    /* print status */
    line_len += ly_print(out, "%s--", (node->flags & LYS_STATUS_DEPRC ? "x" : (node->flags & LYS_STATUS_OBSLT ? "o" : "+")));
    /* print config flags (or special opening for case, choice) */
    line_len += tree_print_config(out, node, opts->spec_config);
    /* print optionally prefix */
    node_len = tree_print_prefix(out, node, opts);
    /* print name */
    node_len += ly_print(out, node->name);

    /* print one-character opts */
    switch (node->nodetype & mask) {
    case LYS_LEAF:
        if (!(node->flags & LYS_MAND_TRUE) && !tree_leaf_is_mandatory(node)) {
            node_len += ly_print(out, "?");
        }
        break;
    case LYS_ANYDATA:
    case LYS_ANYXML:
        if (!(node->flags & LYS_MAND_TRUE)) {
            node_len += ly_print(out, "?");
        }
        break;
    case LYS_CONTAINER:
        if (((struct lys_node_container *)node)->presence) {
            node_len += ly_print(out, "!");
        }
        break;
    case LYS_LIST:
    case LYS_LEAFLIST:
        node_len += ly_print(out, "*");
        break;
    case LYS_CASE:
        /* kinda shady, but consistent in a way */
        node_len += ly_print(out, ")");
        break;
    case LYS_CHOICE:
        node_len += ly_print(out, ")");
        if (!(node->flags & LYS_MAND_TRUE)) {
            node_len += ly_print(out, "?");
        }
        break;
    default:
        break;
    }
    line_len += node_len;

    /**
     * wrapped print
     */

    /* learn next level indent (there is never a sibling for subtree) */
    ++level;
    if (!subtree) {
        tree_next_indent(level, node, aug_parent, opts);
    }

    /* print type/keys */
    switch (node->nodetype & mask) {
    case LYS_LEAF:
    case LYS_LEAFLIST:
        assert(max_name_len);
        text_indent = LY_TREE_TYPE_INDENT + (uint8_t)(max_name_len - node_len);
        text_len = tree_print_type(out, &((struct lys_node_leaf *)node)->type, opts->options, &text_str);
        line_len = tree_print_wrap(out, level, line_len, text_indent, text_len, opts);
        line_len += ly_print(out, text_str);
        lydict_remove(opts->module->ctx, text_str);
        break;
    case LYS_ANYDATA:
        assert(max_name_len);
        text_indent = LY_TREE_TYPE_INDENT + (uint8_t)(max_name_len - node_len);
        line_len = tree_print_wrap(out, level, line_len, text_indent, 7, opts);
        line_len += ly_print(out, "anydata");
        break;
    case LYS_ANYXML:
        assert(max_name_len);
        text_indent = LY_TREE_TYPE_INDENT + (uint8_t)(max_name_len - node_len);
        line_len = tree_print_wrap(out, level, line_len, text_indent, 6, opts);
        line_len += ly_print(out, "anyxml");
        break;
    case LYS_LIST:
        text_len = tree_print_keys(out, ((struct lys_node_list *)node)->keys, ((struct lys_node_list *)node)->keys_size,
                                   opts, &text_str);
        if (text_len) {
            line_len = tree_print_wrap(out, level, line_len, 1, text_len, opts);
            line_len += ly_print(out, text_str);
            lydict_remove(opts->module->ctx, text_str);
        }
        break;
    default:
        break;
    }

    /* print default */
    if (!(opts->options & LYS_OUTOPT_TREE_RFC)) {
        switch (node->nodetype & mask) {
        case LYS_LEAF:
            text_str = ((struct lys_node_leaf *)node)->dflt;
            if (text_str) {
                line_len = tree_print_wrap(out, level, line_len, 1, 2 + strlen(text_str), opts);
                line_len += ly_print(out, "<%s>", text_str);
            }
            break;
        case LYS_CHOICE:
            sub = ((struct lys_node_choice *)node)->dflt;
            if (sub) {
                line_len = tree_print_wrap(out, level, line_len, 1, 2 + strlen(sub->name), opts);
                line_len += ly_print(out, "<%s>", sub->name);
            }
            break;
        default:
            break;
        }
    }

    /* print if-features */
    switch (node->nodetype & mask) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_CHOICE:
    case LYS_CASE:
    case LYS_ANYDATA:
    case LYS_ANYXML:
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_RPC:
    case LYS_ACTION:
    case LYS_NOTIF:
    case LYS_USES:
        if (node->parent && (node->parent->nodetype == LYS_AUGMENT)) {
            /* if-features from an augment are de facto inherited */
            text_len = tree_print_features(out, node->iffeature, node->iffeature_size,
                                           node->parent->iffeature, node->parent->iffeature_size, opts, &text_str);
        } else {
            text_len = tree_print_features(out, node->iffeature, node->iffeature_size, NULL, 0, opts, &text_str);
        }
        if (text_len) {
            line_len = tree_print_wrap(out, level, line_len, 1, text_len, opts);
            line_len += ly_print(out, text_str);
            lydict_remove(opts->module->ctx, text_str);
        }
        break;
    default:
        /* only grouping */
        break;
    }

    /* this node is finished printing */
    ly_print(out, "\n");

    if ((subtree == 1) || ((node->nodetype & mask) == LYS_USES)) {
        /* we are printing subtree parents, finish here (or uses option) */
        return;
    }

    /* set special config flag */
    switch (node->nodetype & mask) {
    case LYS_INPUT:
        opts->spec_config = 1;
        break;
    case LYS_OUTPUT:
    case LYS_NOTIF:
        opts->spec_config = 2;
        break;
    default:
        break;
    }

print_children:
    /* set child mask and learn the longest child name (needed only if a child can have type) */
    switch (node->nodetype & mask) {
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYDATA:
    case LYS_ANYXML:
        child_mask = 0;
        max_child_len = 0;
        break;
    case LYS_RPC:
    case LYS_ACTION:
        child_mask = LYS_INPUT | LYS_OUTPUT;
        max_child_len = 0;
        break;
    case LYS_CHOICE:
        child_mask = LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    case LYS_CASE:
    case LYS_NOTIF:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    case LYS_USES:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES | LYS_ACTION | LYS_NOTIF;
        /* inherit the name length from the parent, it does not change */
        max_child_len = max_name_len;
        break;
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_GROUPING:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES | LYS_ACTION | LYS_NOTIF;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    default:
        child_mask = 0;
        max_child_len = 0;
        LOGINT(node->module->ctx);
        break;
    }

    /* print descendants (children) */
    if (child_mask) {
        LY_TREE_FOR(node->child, sub) {
            /* submodule, foreign augments */
            if (opts->module->type && (sub->parent != node) && (sub->module != opts->module)) {
                continue;
            }
            tree_print_snode(out, level, max_child_len, sub, child_mask, NULL, 0, opts);
        }
    }

    /* reset special config flag */
    switch (node->nodetype & mask) {
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        opts->spec_config = 0;
        break;
    default:
        break;
    }
}